

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp.c
# Opt level: O0

bool_t ecpSeemsValidGroup(ec_o *ec,void *stack)

{
  bool_t bVar1;
  int iVar2;
  word wVar3;
  size_t sVar4;
  word *a;
  word *in_RSI;
  word *in_RDI;
  word *t3;
  word *t2;
  word *t1;
  word w;
  int cmp;
  size_t n;
  ec_o *in_stack_ffffffffffffffb0;
  size_t *stack_00;
  ec_o *ec_00;
  word *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  size_t *a_00;
  
  sVar4 = *(size_t *)(in_RDI[3] + 0x30);
  ec_00 = (ec_o *)(in_RSI + sVar4 + 1);
  stack_00 = &(ec_00->hdr).o_count + sVar4;
  a_00 = stack_00 + sVar4 * 2;
  bVar1 = ecIsOperableGroup(in_stack_ffffffffffffffb0);
  if ((bVar1 == 0) || (bVar1 = ecpIsOnA(in_RSI,ec_00,stack_00), bVar1 == 0)) {
    return 0;
  }
  wVar3 = zzMulW(in_RSI,(word *)in_RDI[7],sVar4 + 1,in_RDI[10]);
  in_RSI[sVar4 + 1] = wVar3;
  wVar3 = zzSubW2(in_RSI,sVar4 + 2,1);
  if (wVar3 != 0) {
    return 0;
  }
  iVar2 = wwCmp2(in_stack_ffffffffffffffd0,(size_t)in_RSI,(word *)ec_00,(size_t)stack_00);
  if (iVar2 < 0) {
    zzSub(in_RSI,*(word **)(in_RDI[3] + 0x18),in_RSI,sVar4);
  }
  else {
    in_stack_ffffffffffffffb0 = (ec_o *)(in_RSI + sVar4);
    wVar3 = zzSub2(in_RSI,*(word **)(in_RDI[3] + 0x18),sVar4);
    zzSubW2((word *)in_stack_ffffffffffffffb0,2,wVar3);
  }
  sVar4 = wwWordSize(in_RSI,sVar4 + 2);
  if (*(ulong *)(in_RDI[3] + 0x30) < sVar4) {
    return 0;
  }
  zzSqr(in_RDI,a_00,sVar4,(void *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  a = (word *)wwGetBits((word *)ec_00,0,2);
  wwShLo((word *)ec_00,(size_t)stack_00,(size_t)in_stack_ffffffffffffffb0);
  iVar2 = wwCmp2(a,(size_t)in_RSI,(word *)ec_00,(size_t)stack_00);
  if ((iVar2 < 1) && ((iVar2 != 0 || (a == (word *)0x0)))) {
    return 1;
  }
  return 0;
}

Assistant:

bool_t ecpSeemsValidGroup(const ec_o* ec, void* stack)
{
	size_t n = ec->f->n;
	int cmp;
	word w;
	// переменные в stack
	word* t1 = (word*)stack;
	word* t2 = t1 + n + 1;
	word* t3 = t2 + n + 2;
	stack = t3 + 2 * n;
	// pre
	ASSERT(ecIsOperable(ec));
	// ecIsOperableGroup(ec) == TRUE? base \in ec?
	if (!ecIsOperableGroup(ec) ||
		!ecpIsOnA(ec->base, ec, stack))
		return FALSE;
	// [n + 2]t1 <- order * cofactor
	t1[n + 1] = zzMulW(t1, ec->order, n + 1, ec->cofactor);
	// t1 <- |t1 - (p + 1)|
	if (zzSubW2(t1, n + 2, 1))
		return FALSE;
	if (wwCmp2(t1, n + 2, ec->f->mod, n) >= 0)
		zzSubW2(t1 + n, 2, zzSub2(t1, ec->f->mod, n));
	else
		zzSub(t1, ec->f->mod, t1, n);
	// n <- длина t1
	n = wwWordSize(t1, n + 2);
	// n > ec->f->n => t1^2 > 4 p
	if (n > ec->f->n)
		return FALSE;
	// [2n]t2 <- ([n]t1)^2
	zzSqr(t2, t1, n, stack);
	// условие Хассе: t2 <= 4 p?
	w = wwGetBits(t2, 0, 2);
	wwShLo(t2, 2 * n, 2);
	cmp = wwCmp2(t2, 2 * n, ec->f->mod, ec->f->n);
	if (cmp > 0 || cmp == 0 && w != 0)
		return FALSE;
	// все нормально
	return TRUE;
}